

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_reader.h
# Opt level: O0

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cppwinrt::reader::files<bool(*)(std::basic_string_view<char,std::char_traits<char>>const&)>
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,reader *this,string_view *name,
          _func_bool_basic_string_view<char,_std::char_traits<char>_>_ptr *directory_filter)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  const_reference this_01;
  ulong uVar2;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  string_type local_288;
  undefined1 local_268 [8];
  smatch match;
  regex rx;
  string local_220;
  string local_200 [8];
  string sdk_version;
  string local_1d8;
  _Base_ptr local_1b8;
  undefined1 local_1b0;
  path local_1a8;
  path local_180;
  string local_158;
  path local_138;
  path local_110;
  path local_e8;
  path local_b0;
  reference local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  anon_class_16_2_7baea878 add_directory;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  _func_bool_basic_string_view<char,_std::char_traits<char>_>_ptr *directory_filter_local;
  string_view *name_local;
  reader *this_local;
  
  files._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)directory_filter;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&add_directory.files);
  __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&files._M_t._M_impl.super__Rb_tree_header._M_node_count;
  add_directory.directory_filter =
       (_func_bool_basic_string_view<char,_std::char_traits<char>_>_ptr **)&add_directory.files;
  this_00 = values_abi_cxx11_(this,name);
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  path = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&path);
    if (!bVar1) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set(__return_storage_ptr__,
            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&add_directory.files);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&add_directory.files);
      return __return_storage_ptr__;
    }
    local_88 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
    ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_b0,local_88,auto_format);
    bVar1 = std::filesystem::is_directory(&local_b0);
    std::filesystem::__cxx11::path::~path(&local_b0);
    if (bVar1) {
      ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_110,local_88,auto_format);
      ::std::filesystem::canonical(&local_e8);
      const::{lambda(auto:1&&)#1}::operator()((_lambda_auto_1____1_ *)&__range2,&local_e8);
      std::filesystem::__cxx11::path::~path(&local_e8);
      std::filesystem::__cxx11::path::~path(&local_110);
    }
    else {
      ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_138,local_88,auto_format);
      bVar1 = std::filesystem::is_regular_file(&local_138);
      std::filesystem::__cxx11::path::~path(&local_138);
      if (!bVar1) {
        bVar1 = ::std::operator==(local_88,"local");
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d8,"Spec \'",
                     (allocator<char> *)(sdk_version.field_2._M_local_buf + 0xf));
          throw_invalid<std::__cxx11::string,char[35]>
                    (&local_1d8,local_88,(char (*) [35])"\' not supported outside of Windows");
        }
        ::std::__cxx11::string::string(local_200);
        bVar1 = ::std::operator==(local_88,"sdk");
        if ((!bVar1) && (bVar1 = ::std::operator==(local_88,"sdk+"), !bVar1)) {
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&match._M_begin,
                     "((\\d+)\\.(\\d+)\\.(\\d+)\\.(\\d+))\\+?",0x10);
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_268);
          bVar1 = ::std::
                  regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                            (local_88,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       *)local_268,
                             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&match._M_begin
                             ,0);
          if (bVar1) {
            this_01 = std::__cxx11::
                      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    *)local_268,1);
            std::__cxx11::
            sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::str(&local_288,this_01);
            ::std::__cxx11::string::operator=(local_200,(string *)&local_288);
            ::std::__cxx11::string::~string((string *)&local_288);
          }
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_268);
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&match._M_begin);
          uVar2 = ::std::__cxx11::string::empty();
          if ((uVar2 & 1) != 0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2d0,"Path \'",&local_2d1);
            throw_invalid<std::__cxx11::string,char[29]>
                      (&local_2d0,local_88,(char (*) [29])"\' is not a file or directory");
          }
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2a8,"Spec \'",&local_2a9);
          throw_invalid<std::__cxx11::string,char[35]>
                    (&local_2a8,local_88,(char (*) [35])"\' not supported outside of Windows");
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_220,"Spec \'",
                   (allocator<char> *)
                   ((long)&rx._M_automaton.
                           super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + 7));
        throw_invalid<std::__cxx11::string,char[35]>
                  (&local_220,local_88,(char (*) [35])"\' not supported outside of Windows");
      }
      ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_1a8,local_88,auto_format);
      ::std::filesystem::canonical(&local_180);
      std::filesystem::__cxx11::path::string(&local_158,&local_180);
      pVar3 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&add_directory.files,&local_158);
      local_1b8 = (_Base_ptr)pVar3.first._M_node;
      local_1b0 = pVar3.second;
      ::std::__cxx11::string::~string((string *)&local_158);
      std::filesystem::__cxx11::path::~path(&local_180);
      std::filesystem::__cxx11::path::~path(&local_1a8);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

auto files(std::string_view const& name, F directory_filter) const
        {
            std::set<std::string> files;

            auto add_directory = [&](auto&& path)
            {
                for (auto&& file : std::filesystem::directory_iterator(path))
                {
                    if (std::filesystem::is_regular_file(file))
                    {
                        auto filename = file.path().string();

                        if (directory_filter(filename))
                        {
                            files.insert(filename);
                        }
                    }
                }
            };

            for (auto&& path : values(name))
            {
                if (std::filesystem::is_directory(path))
                {
                    add_directory(std::filesystem::canonical(path));
                    continue;
                }

                if (std::filesystem::is_regular_file(path))
                {
                    files.insert(std::filesystem::canonical(path).string());
                    continue;
                }
                if (path == "local")
                {
#if defined(_WIN32) || defined(_WIN64)
                    std::array<char, 260> local{};
#ifdef _WIN64
                    ExpandEnvironmentStringsA("%windir%\\System32\\WinMetadata", local.data(), static_cast<uint32_t>(local.size()));
#else
                    ExpandEnvironmentStringsA("%windir%\\SysNative\\WinMetadata", local.data(), static_cast<uint32_t>(local.size()));
#endif
                    add_directory(local.data());
#else /* defined(_WIN32) || defined(_WIN64) */
                    throw_invalid("Spec '", path, "' not supported outside of Windows");
#endif /* defined(_WIN32) || defined(_WIN64) */
                    continue;
                }

                std::string sdk_version;

                if (path == "sdk" || path == "sdk+")
                {
#if defined(_WIN32) || defined(_WIN64)
                    sdk_version = get_sdk_version();
#else /* defined(_WIN32) || defined(_WIN64) */
                    throw_invalid("Spec '", path, "' not supported outside of Windows");
#endif /* defined(_WIN32) || defined(_WIN64) */
                }
                else
                {
                    std::regex rx(R"(((\d+)\.(\d+)\.(\d+)\.(\d+))\+?)");
                    std::smatch match;

                    if (std::regex_match(path, match, rx))
                    {
                        sdk_version = match[1].str();
                    }
                }

                if (!sdk_version.empty())
                {
#if defined(_WIN32) || defined(_WIN64)
                    auto sdk_path = get_sdk_path();
                    auto xml_path = sdk_path;
                    xml_path /= L"Platforms\\UAP";
                    xml_path /= sdk_version;
                    xml_path /= L"Platform.xml";

                    add_files_from_xml(files, sdk_version, xml_path, sdk_path, xml_requirement::required);

                    if (path.back() != '+')
                    {
                        continue;
                    }

                    for (auto&& item : std::filesystem::directory_iterator(sdk_path / L"Extension SDKs"))
                    {
                        xml_path = item.path() / sdk_version;
                        xml_path /= L"SDKManifest.xml";

                        // Not all Extension SDKs include an SDKManifest.xml file; ignore those which do not (e.g. WindowsIoT).
                        add_files_from_xml(files, sdk_version, xml_path, sdk_path, xml_requirement::optional);
                    }
#else /* defined(_WIN32) || defined(_WIN64) */
                    throw_invalid("Spec '", path, "' not supported outside of Windows");
#endif /* defined(_WIN32) || defined(_WIN64) */

                    continue;
                }

                throw_invalid("Path '", path, "' is not a file or directory");
            }

            return files;
        }